

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

Specification * ExprEval::Operator::get_specification(string *symbol)

{
  vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
  *this;
  __type _Var1;
  size_type sVar2;
  reference pvVar3;
  ulong local_28;
  size_t i;
  vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
  *table;
  string *symbol_local;
  
  this = specification_table;
  local_28 = 0;
  while( true ) {
    sVar2 = std::
            vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
            ::size(this);
    if (sVar2 <= local_28) {
      return (Specification *)0x0;
    }
    pvVar3 = std::
             vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
             ::at(this,local_28);
    _Var1 = std::operator==(&pvVar3->symbol,symbol);
    if (_Var1) break;
    local_28 = local_28 + 1;
  }
  pvVar3 = std::
           vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
           ::at(this,local_28);
  return pvVar3;
}

Assistant:

Operator::Specification* get_specification(const std::string& symbol){
            auto table = specification_table;
            for(size_t i=0; i<table->size(); ++i){
                if(table->at(i).symbol == symbol) return &(table->at(i));
            }
            return nullptr;
        }